

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.hpp
# Opt level: O1

void __thiscall
bredis::single_command_t::
single_command_t<char_const(&)[5],char_const(&)[4],char_const(&)[7],char_const(&)[1],char_const(&)[7],char_const(&)[1],void>
          (single_command_t *this,char (*args) [5],char (*args_1) [4],char (*args_2) [7],
          char (*args_3) [1],char (*args_4) [7],char (*args_5) [1])

{
  initializer_list<boost::basic_string_ref<char,_std::char_traits<char>_>_> __l;
  allocator_type local_91;
  basic_string_ref<char,_std::char_traits<char>_> local_90;
  char (*local_80) [4];
  size_t local_78;
  char (*local_70) [7];
  size_t local_68;
  char (*local_60) [1];
  size_t local_58;
  char (*local_50) [7];
  size_t local_48;
  char (*local_40) [1];
  size_t local_38;
  
  local_90.ptr_ = *args;
  local_90.len_ = strlen(*args);
  local_80 = args_1;
  local_78 = strlen(*args_1);
  local_70 = args_2;
  local_68 = strlen(*args_2);
  local_60 = args_3;
  local_58 = strlen(*args_3);
  local_50 = args_4;
  local_48 = strlen(*args_4);
  local_40 = args_5;
  local_38 = strlen(*args_5);
  __l._M_len = 6;
  __l._M_array = &local_90;
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::vector(&this->arguments,__l,&local_91);
  return;
}

Assistant:

single_command_t(Args &&... args) : arguments{std::forward<Args>(args)...} {
        static_assert(sizeof...(Args) >= 1, "Empty command is not allowed");
    }